

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
vkt::shaderexecutor::
FixedGenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_4>
::doApply(IRet *__return_storage_ptr__,
         FixedGenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_4>
         *this,EvalContext *ctx,IArgs *iargs)

{
  bool *pbVar1;
  long *plVar2;
  long lVar3;
  undefined8 local_68;
  double dStack_60;
  undefined8 local_58;
  bool *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Void *local_38;
  
  tcu::Vector<tcu::Interval,_4>::Vector(__return_storage_ptr__);
  plVar2 = (long *)(**(code **)(*(long *)this + 0x58))(this);
  for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x18) {
    local_50 = &iargs->a->m_data[0].m_hasNaN + lVar3;
    local_38 = iargs->d;
    local_48 = *(undefined4 *)&iargs->b;
    uStack_44 = *(undefined4 *)((long)&iargs->b + 4);
    uStack_40 = *(undefined4 *)&iargs->c;
    uStack_3c = *(undefined4 *)((long)&iargs->c + 4);
    (**(code **)(*plVar2 + 0x40))(&local_68,plVar2,ctx,&local_50);
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar3) = local_58;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar3;
    *(undefined8 *)pbVar1 = local_68;
    *(double *)(pbVar1 + 8) = dStack_60;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext& ctx,
												 const IArgs&		iargs) const
	{
		IRet				ret;
		const Func<Sig_>&	func	= this->doGetScalarFunc();

		for (int ndx = 0; ndx < Size; ++ndx)
			ret[ndx] = func.apply(ctx, iargs.a[ndx], iargs.b, iargs.c[ndx], iargs.d[ndx]);

		return ret;
	}